

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpxpes_parser.cc
# Opt level: O3

bool __thiscall
libwebm::VpxPesParser::FindStartCode(VpxPesParser *this,size_t origin,size_t *offset)

{
  ulong uVar1;
  long lVar2;
  
  uVar1 = *(ulong *)(this + 0x38);
  if (((*(long *)(this + 0x70) + 2U < uVar1) && (2 < uVar1 - origin)) && (uVar1 - origin != 3)) {
    lVar2 = *(long *)(this + 0x58);
    do {
      if (((*(char *)(lVar2 + origin) == '\0') && (*(char *)(lVar2 + 1 + origin) == '\0')) &&
         (*(char *)(lVar2 + 2 + origin) == '\x01')) {
        *offset = origin;
        return true;
      }
      origin = origin + 1;
    } while (uVar1 - 3 != origin);
  }
  return false;
}

Assistant:

bool VpxPesParser::FindStartCode(std::size_t origin,
                                 std::size_t* offset) const {
  if (read_pos_ + 2 >= pes_file_size_)
    return false;

  const std::size_t length = pes_file_size_ - origin;
  if (length < 3)
    return false;

  const uint8_t* const data = &pes_file_data_[origin];
  for (std::size_t i = 0; i < length - 3; ++i) {
    if (data[i] == 0 && data[i + 1] == 0 && data[i + 2] == 1) {
      *offset = origin + i;
      return true;
    }
  }

  return false;
}